

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clienttest.cpp
# Opt level: O0

void MyErrorMsgHandler(int iLevel,char *szMsg)

{
  undefined8 in_RSI;
  int in_EDI;
  char *szLevel;
  char *local_18;
  
  local_18 = (char *)0x0;
  if (in_EDI == 4) {
    local_18 = "Debug";
  }
  else if (in_EDI == 3) {
    local_18 = "Info";
  }
  else if (in_EDI == 2) {
    local_18 = "Warning";
  }
  else if (in_EDI == 1) {
    local_18 = "Error";
  }
  printf("  %s: %s\n",local_18,in_RSI);
  return;
}

Assistant:

void MyErrorMsgHandler(int iLevel, const char *szMsg)
{
  const char *szLevel = NULL;

  if (iLevel == VL_Debug) {
    szLevel = "Debug";
  } else if (iLevel == VL_Info) {
    szLevel = "Info";
  } else if (iLevel == VL_Warning) {
    szLevel = "Warning";
  } else if (iLevel == VL_Error) {
    szLevel = "Error";
  }
  printf("  %s: %s\n", szLevel, szMsg);
}